

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  const_reference pvVar4;
  int local_48;
  int local_38;
  int local_34;
  int32_t i;
  int local_2c;
  int local_28;
  int count;
  int32_t index;
  int32_t pixel_count_local;
  pixel_type *start_pos_local;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
  *pjStack_10;
  pixel_type ra_local;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
  *this_local;
  
  local_28 = 0;
  count = pixel_count;
  _index = start_pos;
  start_pos_local._6_2_ = ra;
  pjStack_10 = this;
  do {
    bVar2 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar2) break;
    pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    i = 1 << ((byte)*pvVar4 & 0x1f);
    local_34 = count - local_28;
    piVar3 = std::min<int>(&i,&local_34);
    iVar1 = *piVar3;
    local_28 = iVar1 + local_28;
    local_2c = iVar1;
    if (count < local_28) {
      __assert_fail("index <= pixel_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x2d2,
                    "int32_t charls::jls_codec<charls::default_traits<unsigned short, unsigned short>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::default_traits<unsigned short, unsigned short>, Strategy = charls::decoder_strategy]"
                   );
    }
    pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    if (iVar1 == 1 << ((byte)*pvVar4 & 0x1f)) {
      increment_run_index(this);
    }
  } while (local_28 != count);
  if (local_28 != count) {
    pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    if (*pvVar4 < 1) {
      local_48 = 0;
    }
    else {
      pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
      local_48 = decoder_strategy::read_value(&this->super_decoder_strategy,*pvVar4);
    }
    local_28 = local_48 + local_28;
  }
  if (count < local_28) {
    impl::throw_jpegls_error(InvalidCompressedData);
  }
  for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
    _index[local_38] = start_pos_local._6_2_;
  }
  return local_28;
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }